

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void normalize_suite::normalize_three(void)

{
  size_type *psVar1;
  initializer_list<int> __l;
  initializer_list<int> input;
  initializer_list<int> __l_00;
  initializer_list<int> input_00;
  initializer_list<int> __l_01;
  initializer_list<int> input_01;
  initializer_list<int> __l_02;
  initializer_list<int> input_02;
  initializer_list<int> __l_03;
  initializer_list<int> input_03;
  iterator pvVar2;
  iterator pvVar3;
  reference piVar4;
  size_type sVar5;
  iterator second_begin;
  iterator second_end;
  iterator iVar6;
  iterator iVar7;
  allocator<int> local_3f5;
  int local_3f4;
  iterator local_3f0;
  size_type local_3e8;
  undefined1 local_3e0 [8];
  vector<int,_std::allocator<int>_> expect_4;
  iterator local_3b8;
  int local_3a8 [8];
  iterator local_388;
  undefined8 local_380;
  iterator local_378;
  iterator local_368;
  int *local_358;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_350;
  iterator local_348;
  iterator local_338;
  allocator<int> local_325;
  int local_324;
  iterator local_320;
  size_type local_318;
  undefined1 local_310 [8];
  vector<int,_std::allocator<int>_> expect_3;
  iterator local_2e8;
  int local_2d8 [8];
  iterator local_2b8;
  undefined8 local_2b0;
  iterator local_2a8;
  iterator local_298;
  int *local_288;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_280;
  iterator local_278;
  iterator local_268;
  allocator<int> local_255;
  int local_254;
  iterator local_250;
  size_type local_248;
  undefined1 local_240 [8];
  vector<int,_std::allocator<int>_> expect_2;
  iterator local_218;
  int local_208 [8];
  iterator local_1e8;
  undefined8 local_1e0;
  iterator local_1d8;
  iterator local_1c8;
  int *local_1b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  iterator local_1a8;
  iterator local_198;
  allocator<int> local_185;
  int local_184;
  iterator local_180;
  size_type local_178;
  undefined1 local_170 [8];
  vector<int,_std::allocator<int>_> expect_1;
  iterator local_148;
  int local_138 [8];
  iterator local_118;
  undefined8 local_110;
  iterator local_108;
  iterator local_f8;
  int *local_e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e0;
  iterator local_d8;
  iterator local_c8;
  allocator<int> local_a5;
  int local_a4;
  iterator local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> expect;
  iterator local_68;
  int local_58 [4];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0;
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)local_38,pvVar2,pvVar3);
  local_58[0] = 0xb;
  local_58[1] = 0x16;
  local_58[2] = 0x21;
  local_58[3] = 0x2c;
  local_48 = local_58;
  local_40 = 4;
  input_03._M_len = 4;
  input_03._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_03);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,3);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_68);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xecc,"void normalize_suite::normalize_three()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xece,"void normalize_suite::normalize_three()",piVar4 == pvVar2);
  local_a4 = 0x2c;
  local_a0 = &local_a4;
  local_98 = 1;
  std::allocator<int>::allocator(&local_a5);
  __l_03._M_len = local_98;
  __l_03._M_array = local_a0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_90,__l_03,&local_a5);
  std::allocator<int>::~allocator(&local_a5);
  local_c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_d8 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_e0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_90);
  local_e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_90);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xed2,"void normalize_suite::normalize_three()",local_c8,local_d8,local_e0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_e8);
  local_f8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_108 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xed4,"void normalize_suite::normalize_three()",local_f8,local_108,pvVar2,
             pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  local_138[0] = 0xb;
  local_138[1] = 0x16;
  local_138[2] = 0x21;
  local_138[3] = 0x2c;
  local_138[4] = 0x37;
  local_118 = local_138;
  local_110 = 5;
  input_02._M_len = 5;
  input_02._M_array = local_118;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_02);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,3);
  local_148 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_148);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeda,"void normalize_suite::normalize_three()",piVar4 == pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xedc,"void normalize_suite::normalize_three()",piVar4 == pvVar2);
  local_184 = 0x37;
  local_180 = &local_184;
  local_178 = 1;
  std::allocator<int>::allocator(&local_185);
  __l_02._M_len = local_178;
  __l_02._M_array = local_180;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,__l_02,&local_185);
  std::allocator<int>::~allocator(&local_185);
  local_198 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1a8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1b0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_170);
  local_1b8 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_170);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xee0,"void normalize_suite::normalize_three()",local_198,local_1a8,local_1b0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_1b8);
  local_1c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1d8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xee2,"void normalize_suite::normalize_three()",local_1c8,local_1d8,pvVar2,
             pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_170);
  local_208[4] = 0x37;
  local_208[5] = 0x42;
  local_208[0] = 0xb;
  local_208[1] = 0x16;
  local_208[2] = 0x21;
  local_208[3] = 0x2c;
  local_1e8 = local_208;
  local_1e0 = 6;
  input_01._M_len = 6;
  input_01._M_array = local_1e8;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_01);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,3);
  local_218 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_218);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xee8,"void normalize_suite::normalize_three()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeea,"void normalize_suite::normalize_three()",piVar4 == pvVar2);
  local_254 = 0x42;
  local_250 = &local_254;
  local_248 = 1;
  std::allocator<int>::allocator(&local_255);
  __l_01._M_len = local_248;
  __l_01._M_array = local_250;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_240,__l_01,&local_255);
  std::allocator<int>::~allocator(&local_255);
  local_268 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_278 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_280._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_240);
  local_288 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_240);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeee,"void normalize_suite::normalize_three()",local_268,local_278,local_280,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_288);
  local_298 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2a8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xef0,"void normalize_suite::normalize_three()",local_298,local_2a8,pvVar2,
             pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_240);
  local_2d8[4] = 0x37;
  local_2d8[5] = 0x42;
  local_2d8[6] = 0x4d;
  local_2d8[0] = 0xb;
  local_2d8[1] = 0x16;
  local_2d8[2] = 0x21;
  local_2d8[3] = 0x2c;
  local_2b8 = local_2d8;
  local_2b0 = 7;
  input_00._M_len = 7;
  input_00._M_array = local_2b8;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_00);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,3);
  local_2e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_2e8);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xef6,"void normalize_suite::normalize_three()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xef8,"void normalize_suite::normalize_three()",piVar4 == pvVar2);
  local_324 = 0x4d;
  local_320 = &local_324;
  local_318 = 1;
  std::allocator<int>::allocator(&local_325);
  __l_00._M_len = local_318;
  __l_00._M_array = local_320;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_310,__l_00,&local_325);
  std::allocator<int>::~allocator(&local_325);
  local_338 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_348 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_350._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_310);
  local_358 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_310);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xefc,"void normalize_suite::normalize_three()",local_338,local_348,local_350,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_358);
  local_368 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_378 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xefe,"void normalize_suite::normalize_three()",local_368,local_378,pvVar2,
             pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_310);
  local_3a8[4] = 0x37;
  local_3a8[5] = 0x42;
  local_3a8[6] = 0x4d;
  local_3a8[7] = 0x58;
  local_3a8[0] = 0xb;
  local_3a8[1] = 0x16;
  local_3a8[2] = 0x21;
  local_3a8[3] = 0x2c;
  local_388 = local_3a8;
  local_380 = 8;
  input._M_len = 8;
  input._M_array = local_388;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,3);
  local_3b8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_3b8);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xf04,"void normalize_suite::normalize_three()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xf06,"void normalize_suite::normalize_three()",piVar4 == pvVar2);
  local_3f4 = 0x58;
  local_3f0 = &local_3f4;
  local_3e8 = 1;
  std::allocator<int>::allocator(&local_3f5);
  __l._M_len = local_3e8;
  __l._M_array = local_3f0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3e0,__l,&local_3f5);
  std::allocator<int>::~allocator(&local_3f5);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar7 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_3e0);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_3e0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xf0a,"void normalize_suite::normalize_three()",iVar6,iVar7,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar7 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xf0c,"void normalize_suite::normalize_three()",iVar6,iVar7,pvVar2,pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_3e0);
  return;
}

Assistant:

void normalize_three()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // X X X 44 => 44 X X X
        span = { 11, 22, 33, 44 };
        span.remove_front(3);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 55 X X X => 55 X X X
        span = { 11, 22, 33, 44, 55 };
        span.remove_front(3);
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X 66 X X => 66 X X X
        span = { 11, 22, 33, 44, 55, 66 };
        span.remove_front(3);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X X 77 X => 77 X X X
        span = { 11, 22, 33, 44, 55, 66, 77 };
        span.remove_front(3);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 77 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X X X 88 => 88 X X X
        span = { 11, 22, 33, 44, 55, 66, 77, 88 };
        span.remove_front(3);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 88 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
}